

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall
argsman_tests::util_ParseInvalidParameters::test_method(util_ParseInvalidParameters *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *plVar3;
  long in_FS_OFFSET;
  string error;
  char *argv [2];
  TestArgsManager test;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  char *in_stack_fffffffffffff9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  const_string *in_stack_fffffffffffff9c0;
  char (*in_stack_fffffffffffff9c8) [12];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff9d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffff9d8;
  TestArgsManager *in_stack_fffffffffffff9e0;
  undefined7 in_stack_fffffffffffff9e8;
  undefined1 in_stack_fffffffffffff9ef;
  string *in_stack_fffffffffffffa50;
  ArgsManager *error_00;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  undefined8 in_stack_fffffffffffffa60;
  ArgsManager *in_stack_fffffffffffffa68;
  ArgsManager *this_00;
  undefined1 *local_560;
  undefined1 local_520 [16];
  undefined1 local_510 [64];
  lazy_ostream local_4b0 [2];
  assertion_result local_490 [2];
  undefined1 local_458 [16];
  undefined1 local_448 [64];
  const_string local_408 [2];
  lazy_ostream local_3e8 [2];
  assertion_result local_3c8 [2];
  undefined1 local_390 [16];
  undefined1 local_380 [64];
  const_string local_340 [2];
  lazy_ostream local_320 [2];
  assertion_result local_300 [2];
  undefined4 local_2c4;
  undefined1 local_2a8 [32];
  char *local_288;
  char *local_280;
  undefined1 local_278 [40];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffff998);
  local_2c4 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[12],_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,(Flags *)in_stack_fffffffffffff9c0)
  ;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff998);
  __l._M_len._0_7_ = in_stack_fffffffffffff9e8;
  __l._M_array = (iterator)in_stack_fffffffffffff9e0;
  __l._M_len._7_1_ = in_stack_fffffffffffff9ef;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(in_stack_fffffffffffff9d8,__l,(allocator_type *)in_stack_fffffffffffff9d0);
  TestArgsManager::SetupArgs(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff9a8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff998);
  local_560 = local_250;
  do {
    local_560 = local_560 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(in_stack_fffffffffffff998);
  } while (local_560 != local_278);
  local_288 = "ignored";
  local_280 = "-registered";
  std::__cxx11::string::string(in_stack_fffffffffffff9b0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    ArgsManager::ParseParameters
              (in_stack_fffffffffffffa68,(int)((ulong)in_stack_fffffffffffffa60 >> 0x20),
               (char **)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               in_stack_fffffffffffffa50);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8,
               SUB81((ulong)in_stack_fffffffffffff9a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_300,local_320,local_340,0xfd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff998);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff998);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,(char (*) [1])in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff9a8 = "\"\"";
    in_stack_fffffffffffff9a0 = "";
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x1e8a49d;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_380,local_390,0xfe,1,2,local_2a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff998);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  local_280 = "-unregistered";
  do {
    error_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    ArgsManager::ParseParameters
              (this_00,(int)((ulong)plVar3 >> 0x20),
               (char **)CONCAT17(uVar2,in_stack_fffffffffffffa58),(string *)error_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8,
               SUB81((ulong)in_stack_fffffffffffff9a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c8,local_3e8,local_408,0x101,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff998);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff998);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,(char (*) [1])in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff9a8 = "\"Invalid parameter -unregistered\"";
    in_stack_fffffffffffff9a0 = "Invalid parameter -unregistered";
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x1e8a49d;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[32]>
              (local_448,local_458,0x102,1,2,local_2a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff998);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_280 = "-test.registered";
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    ArgsManager::ParseParameters
              (this_00,(int)((ulong)plVar3 >> 0x20),
               (char **)CONCAT17(uVar2,in_stack_fffffffffffffa58),(string *)error_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8,
               SUB81((ulong)in_stack_fffffffffffff9a0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_490,local_4b0,(const_string *)&stack0xfffffffffffffb30,0x107,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff998);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff998);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff998);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9a0,(char (*) [1])in_stack_fffffffffffff998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (unsigned_long)in_stack_fffffffffffff998);
    in_stack_fffffffffffff9a8 = "\"Invalid parameter -test.registered\"";
    in_stack_fffffffffffff9a0 = "Invalid parameter -test.registered";
    in_stack_fffffffffffff998 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)0x1e8a49d;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_510,local_520,0x108,1,2,local_2a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff998);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string(&in_stack_fffffffffffff998->first);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffff998);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseInvalidParameters)
{
    TestArgsManager test;
    test.SetupArgs({{"-registered", ArgsManager::ALLOW_ANY}});

    const char* argv[] = {"ignored", "-registered"};
    std::string error;
    BOOST_CHECK(test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "");

    argv[1] = "-unregistered";
    BOOST_CHECK(!test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "Invalid parameter -unregistered");

    // Make sure registered parameters prefixed with a chain type trigger errors.
    // (Previously, they were accepted and ignored.)
    argv[1] = "-test.registered";
    BOOST_CHECK(!test.ParseParameters(2, argv, error));
    BOOST_CHECK_EQUAL(error, "Invalid parameter -test.registered");
}